

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall slang::ast::DiagnosticVisitor::finalize(DiagnosticVisitor *this)

{
  undefined4 uVar1;
  pointer pEVar2;
  size_t sVar3;
  Symbol *this_00;
  InstanceSymbol *instance;
  size_type sVar4;
  GenericClassDefSymbol *this_01;
  pointer ppAVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  _Alloc_hider *p_Var8;
  undefined8 uVar9;
  Type *pTVar10;
  value_type *elements;
  pointer ppGVar11;
  ulong pos0;
  uint uVar12;
  not_null<const_slang::ast::Symbol_*> *sym;
  long lVar13;
  Compilation *pCVar14;
  ulong hash;
  ulong uVar15;
  pointer pbVar16;
  pointer ppIVar17;
  long lVar18;
  bool bVar19;
  pointer ppIVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  iterator __begin2;
  _Iterator<false> __begin4;
  SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  visitedSpecs;
  SmallVector<const_slang::ast::Type_*,_5UL> toVisit;
  Type *local_160;
  pointer local_158;
  pointer local_150;
  undefined1 local_148 [24];
  iterator local_130;
  undefined1 *local_120;
  undefined1 local_118 [72];
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  local_d0;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  byte bStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  byte bStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  byte bStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  undefined1 local_80 [8];
  SpecMap *local_78;
  undefined1 local_70 [64];
  
  pCVar14 = this->compilation;
  if ((pCVar14->hierarchicalAssignments).
      super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pCVar14->hierarchicalAssignments).
      super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->disableCache = true;
    std::
    vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
    ::vector((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
              *)local_118,&pCVar14->hierarchicalAssignments);
    uVar9 = local_118._8_8_;
    for (ppIVar20 = (pointer)local_118._0_8_; ppIVar20 != (pointer)uVar9; ppIVar20 = ppIVar20 + 1) {
      pEVar2 = ((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)
               &((*ppIVar20)->super_InstanceSymbolBase).super_Symbol.name._M_str)->_M_ptr;
      sVar3 = ((__extent_storage<18446744073709551615UL> *)
              &((*ppIVar20)->super_InstanceSymbolBase).super_Symbol.location)->_M_extent_value;
      for (lVar13 = 0; sVar3 << 5 != lVar13; lVar13 = lVar13 + 0x20) {
        this_00 = *(Symbol **)((long)&(pEVar2->symbol).ptr + lVar13);
        if ((this_00->kind == Instance) && (this_00[1].originatingSyntax != (SyntaxNode *)0x0)) {
          Symbol::visit<slang::ast::DiagnosticVisitor&>(this_00,this);
        }
      }
    }
    std::
    _Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
    ::~_Vector_base((_Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                     *)local_118);
  }
  while (pCVar14 = this->compilation,
        (pCVar14->virtualInterfaceInstances).
        super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pCVar14->virtualInterfaceInstances).
        super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
    ::vector((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
              *)local_118,&pCVar14->virtualInterfaceInstances);
    uVar9 = local_118._8_8_;
    pCVar14 = this->compilation;
    ppIVar20 = (pCVar14->virtualInterfaceInstances).
               super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppIVar17 = (pointer)local_118._0_8_;
    if ((pCVar14->virtualInterfaceInstances).
        super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppIVar20) {
      (pCVar14->virtualInterfaceInstances).
      super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppIVar20;
    }
    for (; ppIVar17 != (pointer)uVar9; ppIVar17 = ppIVar17 + 1) {
      instance = *ppIVar17;
      Symbol::visit<slang::ast::DiagnosticVisitor&>((Symbol *)instance,this);
      Compilation::checkVirtualIfaceInstance(this->compilation,instance);
    }
    std::
    _Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
    ::~_Vector_base((_Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                     *)local_118);
  }
  SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  ::SmallSet((SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
              *)local_118);
  local_70._0_8_ = local_70 + 0x18;
  local_70._16_8_ = (BumpAllocator *)0x5;
  do {
    ppGVar11 = (this->genericClasses).
               super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_;
    local_158 = ppGVar11 +
                (this->genericClasses).
                super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.len;
    bVar19 = false;
    while (local_70._8_8_ = (byte *)0x0, ppGVar11 != local_158) {
      local_78 = &(*ppGVar11)->specMap;
      local_150 = ppGVar11;
      local_130 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                  ::begin(&local_78->table_);
      local_120 = local_80;
      while (uVar9 = local_70._0_8_, local_130.p_ != (table_element_pointer)0x0) {
        pTVar10 = (local_130.p_)->second;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pTVar10;
        hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
        pos0 = hash >> ((byte)local_d0.arrays.groups_size_index & 0x3f);
        uVar1 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        pCVar14 = (Compilation *)(ulong)((uint)hash & 7);
        pbVar16 = (pointer)0x0;
        uVar15 = pos0;
        do {
          p_Var8 = (_Alloc_hider *)(local_d0.arrays.groups_)->m + uVar15 * 2;
          local_98 = *(uchar *)&p_Var8->_M_p;
          uStack_97 = *(uchar *)((long)&p_Var8->_M_p + 1);
          uStack_96 = *(uchar *)((long)&p_Var8->_M_p + 2);
          bStack_95 = *(byte *)((long)&p_Var8->_M_p + 3);
          uStack_94 = *(uchar *)((long)&p_Var8->_M_p + 4);
          uStack_93 = *(uchar *)((long)&p_Var8->_M_p + 5);
          uStack_92 = *(uchar *)((long)&p_Var8->_M_p + 6);
          bStack_91 = *(byte *)((long)&p_Var8->_M_p + 7);
          uStack_90 = ((slot_type *)(p_Var8 + 1))->n;
          uStack_8f = ((slot_type *)(p_Var8 + 1))[1].n;
          uStack_8e = ((slot_type *)(p_Var8 + 1))[2].n;
          bStack_8d = ((slot_type *)(p_Var8 + 1))[3].n;
          uStack_8c = ((slot_type *)(p_Var8 + 1))[4].n;
          uStack_8b = ((slot_type *)(p_Var8 + 1))[5].n;
          uStack_8a = ((slot_type *)(p_Var8 + 1))[6].n;
          bStack_89 = ((slot_type *)(p_Var8 + 1))[7].n;
          uVar21 = (uchar)uVar1;
          auVar25[0] = -(local_98 == uVar21);
          uVar22 = (uchar)((uint)uVar1 >> 8);
          auVar25[1] = -(uStack_97 == uVar22);
          uVar23 = (uchar)((uint)uVar1 >> 0x10);
          auVar25[2] = -(uStack_96 == uVar23);
          bVar24 = (byte)((uint)uVar1 >> 0x18);
          auVar25[3] = -(bStack_95 == bVar24);
          auVar25[4] = -(uStack_94 == uVar21);
          auVar25[5] = -(uStack_93 == uVar22);
          auVar25[6] = -(uStack_92 == uVar23);
          auVar25[7] = -(bStack_91 == bVar24);
          auVar25[8] = -(uStack_90 == uVar21);
          auVar25[9] = -(uStack_8f == uVar22);
          auVar25[10] = -(uStack_8e == uVar23);
          auVar25[0xb] = -(bStack_8d == bVar24);
          auVar25[0xc] = -(uStack_8c == uVar21);
          auVar25[0xd] = -(uStack_8b == uVar22);
          auVar25[0xe] = -(uStack_8a == uVar23);
          auVar25[0xf] = -(bStack_89 == bVar24);
          for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
              local_160 = pTVar10, uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
            uVar6 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            if (pTVar10 ==
                *(value_type_pointer)
                 ((long)local_d0.arrays.elements_ + (uVar15 * 0xf + (ulong)uVar6) * 8))
            goto LAB_00261920;
          }
          if ((*(byte *)&pCVar14[0x542].compilationUnits.
                         super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
                         ._M_impl.super__Vector_impl_data._M_start & bStack_89) == 0) break;
          p_Var8 = &pbVar16->_M_dataplus;
          pbVar16 = (pointer)((long)&(pbVar16->_M_dataplus)._M_p + 1);
          uVar15 = (long)&p_Var8->_M_p + uVar15 + 1 & local_d0.arrays.groups_size_mask;
        } while (pbVar16 <= local_d0.arrays.groups_size_mask);
        if (local_d0.size_ctrl.size < local_d0.size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
          ::unchecked_emplace_at<slang::ast::Type_const*>
                    ((locator *)local_148,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                      *)&local_d0,pos0,hash,&local_160);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::ast::Type_const*>
                    ((locator *)local_148,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                      *)&local_d0,hash,&local_160);
        }
        local_148._0_8_ = pTVar10;
        pCVar14 = (Compilation *)local_148;
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                  ((SmallVectorBase<slang::ast::Type_const*> *)local_70,(Type **)pCVar14);
LAB_00261920:
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::increment(&local_130);
      }
      lVar13 = local_70._8_8_ << 3;
      for (lVar18 = 0; lVar13 != lVar18; lVar18 = lVar18 + 8) {
        pCVar14 = (Compilation *)this;
        Symbol::visit<slang::ast::DiagnosticVisitor&>
                  (*(Symbol **)((long)(Segment **)uVar9 + lVar18),this);
        bVar19 = true;
      }
      ppGVar11 = local_150 + 1;
    }
    if (!bVar19) {
      ppGVar11 = (this->genericClasses).
                 super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_;
      sVar4 = (this->genericClasses).
              super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.len;
      for (lVar13 = 0; sVar4 << 3 != lVar13; lVar13 = lVar13 + 8) {
        this_01 = *(GenericClassDefSymbol **)((long)ppGVar11 + lVar13);
        if ((this_01->specMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
            .size_ctrl.size == 0) {
          pTVar10 = GenericClassDefSymbol::getInvalidSpecialization(this_01);
          pCVar14 = (Compilation *)this;
          Symbol::visit<slang::ast::DiagnosticVisitor&>(&pTVar10->super_Symbol,this);
        }
      }
      local_148._0_16_ =
           (undefined1  [16])
           boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
           ::begin(&(this->compilation->attributeMap).table_);
      while ((table_element_pointer)local_148._8_8_ != (table_element_pointer)0x0) {
        ppAVar5 = (((table_element_pointer)local_148._8_8_)->second)._M_ptr;
        sVar3 = (((table_element_pointer)local_148._8_8_)->second)._M_extent._M_extent_value;
        for (lVar13 = 0; sVar3 << 3 != lVar13; lVar13 = lVar13 + 8) {
          AttributeSymbol::getValue(*(AttributeSymbol **)((long)ppAVar5 + lVar13));
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     *)local_148);
      }
      SmallVectorBase<const_slang::ast::Type_*>::cleanup
                ((SmallVectorBase<const_slang::ast::Type_*> *)local_70,(EVP_PKEY_CTX *)pCVar14);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
      ::~table_core(&local_d0);
      return;
    }
  } while( true );
}

Assistant:

void finalize() {
        // Once everything has been visited, go back over and check things that might
        // have been influenced by visiting later symbols.

        // For all hierarchical assignments, make sure we actually visited their
        // target instances and didn't skip them due to caching.
        if (!compilation.hierarchicalAssignments.empty()) {
            disableCache = true;
            auto hierarchicalAssignments = compilation.hierarchicalAssignments;
            for (auto hierRef : hierarchicalAssignments) {
                // Walk the path and visit all instances we find that were previously cached.
                for (auto& [sym, _] : hierRef->path) {
                    if (sym->kind == SymbolKind::Instance) {
                        auto& inst = sym->as<InstanceSymbol>();
                        if (inst.getCanonicalBody() != nullptr)
                            inst.visit(*this);
                    }
                }
            }
        }

        // Check the validity of virtual interface assignments.
        while (!compilation.virtualInterfaceInstances.empty()) {
            auto vii = compilation.virtualInterfaceInstances;
            compilation.virtualInterfaceInstances.clear();

            for (auto inst : vii) {
                inst->visit(*this);
                compilation.checkVirtualIfaceInstance(*inst);
            }
        }

        // Visiting a specialization can trigger more specializations to be made for the
        // same or other generic classes, so we need to be careful here when iterating.
        SmallSet<const Type*, 8> visitedSpecs;
        SmallVector<const Type*> toVisit;
        bool didSomething;
        do {
            didSomething = false;
            for (auto symbol : genericClasses) {
                for (auto& spec : symbol->specializations()) {
                    if (visitedSpecs.emplace(&spec).second)
                        toVisit.push_back(&spec);
                }

                for (auto spec : toVisit) {
                    spec->visit(*this);
                    didSomething = true;
                }

                toVisit.clear();
            }
        } while (didSomething);

        // Go back over and find generic classes that were never instantiated
        // and force an empty one to make sure we collect all diagnostics that
        // don't depend on parameter values.
        for (auto symbol : genericClasses) {
            if (symbol->numSpecializations() == 0)
                symbol->getInvalidSpecialization().visit(*this);
        }

        // Visit all attributes and force their values to resolve.
        for (auto& [_, attrList] : compilation.attributeMap) {
            for (auto attr : attrList)
                attr->getValue();
        }
    }